

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (text_end == (char *)0x0) {
    text_end = ImGui::FindRenderedTextEnd(text,(char *)0x0);
  }
  if (ref_pos == (ImVec2 *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = (pIVar2->DC).LogLinePosY + 1.0 < ref_pos->y;
    (pIVar2->DC).LogLinePosY = ref_pos->y;
  }
  iVar5 = pIVar4->LogStartDepth;
  iVar1 = (pIVar2->DC).TreeDepth;
  if (iVar1 < iVar5) {
    pIVar4->LogStartDepth = iVar1;
    iVar5 = iVar1;
  }
  pcVar8 = text;
  pcVar6 = text;
LAB_00176bb6:
  do {
    if (pcVar8 < text_end) {
      pcVar7 = pcVar8;
      if (*pcVar8 != '\n') {
        pcVar8 = pcVar8 + 1;
        goto LAB_00176bb6;
      }
    }
    else {
      pcVar7 = (char *)0x0;
    }
    pcVar8 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar8 = text_end;
    }
    if ((pcVar8 != pcVar6 || pcVar7 != (char *)0x0) && pcVar8 != (char *)0x0) {
      if ((bool)(pcVar6 != text | bVar3)) {
        ImGui::LogText("\n%*s%.*s",(ulong)(uint)((iVar1 - iVar5) * 4),"");
      }
      else {
        ImGui::LogText(" %.*s",(ulong)(uint)((int)pcVar8 - (int)pcVar6),pcVar6);
      }
    }
    pcVar8 = pcVar8 + 1;
    pcVar6 = pcVar8;
    if (pcVar7 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end = NULL)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = ImGui::FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > window->DC.LogLinePosY + 1);
    if (ref_pos)
        window->DC.LogLinePosY = ref_pos->y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_end = text_remaining;
        while (line_end < text_end)
            if (*line_end == '\n')
                break;
            else
                line_end++;
        if (line_end >= text_end)
            line_end = NULL;

        const bool is_first_line = (text == text_remaining);
        bool is_last_line = false;
        if (line_end == NULL)
        {
            is_last_line = true;
            line_end = text_end;
        }
        if (line_end != NULL && !(is_last_line && (line_end - text_remaining)==0))
        {
            const int char_count = (int)(line_end - text_remaining);
            if (log_new_line || !is_first_line)
                ImGui::LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, text_remaining);
            else
                ImGui::LogText(" %.*s", char_count, text_remaining);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}